

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O1

void anon_unknown.dwarf_38a::printCompdb(char *directory,Edge *edge,EvaluateCommandMode eval_mode)

{
  long lVar1;
  ulong uVar2;
  string rspfile_content;
  string rspfile;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  printf("\n  {\n    \"directory\": \"");
  EncodeJSONString(directory);
  printf("\",\n    \"command\": \"");
  Edge::EvaluateCommand_abi_cxx11_(&local_88,edge,false);
  if (eval_mode != ECM_NORMAL) {
    Edge::GetUnescapedRspfile_abi_cxx11_(&local_68,edge);
    if (((local_68._M_string_length != 0) &&
        (lVar1 = std::__cxx11::string::find((char *)&local_88,(ulong)local_68._M_dataplus._M_p,0),
        1 < lVar1 + 1U)) && (local_88._M_dataplus._M_p[lVar1 + -1] == '@')) {
      local_48.field_2._M_allocated_capacity._0_7_ = 0x656c6966707372;
      local_48.field_2._M_local_buf[7] = '_';
      local_48.field_2._8_7_ = 0x746e65746e6f63;
      local_48._M_string_length = 0xf;
      local_48.field_2._M_local_buf[0xf] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      Edge::GetBinding(&local_a8,edge,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT17(local_48.field_2._M_local_buf[7],
                                 local_48.field_2._M_allocated_capacity._0_7_) + 1);
      }
      uVar2 = std::__cxx11::string::find((char)&local_a8,10);
      while (uVar2 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)&local_a8,uVar2,1,'\x01');
        uVar2 = std::__cxx11::string::find((char)&local_a8,10);
      }
      std::__cxx11::string::replace
                ((ulong)&local_88,lVar1 - 1,(char *)(local_68._M_string_length + 1),
                 (ulong)local_a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  EncodeJSONString(local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  printf("\",\n    \"file\": \"");
  EncodeJSONString(((*(edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->path_)._M_dataplus._M_p);
  printf("\",\n    \"output\": \"");
  EncodeJSONString(((*(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->path_)._M_dataplus._M_p);
  printf("\"\n  }");
  return;
}

Assistant:

void printCompdb(const char* const directory, const Edge* const edge,
                 const EvaluateCommandMode eval_mode) {
  printf("\n  {\n    \"directory\": \"");
  EncodeJSONString(directory);
  printf("\",\n    \"command\": \"");
  EncodeJSONString(EvaluateCommandWithRspfile(edge, eval_mode).c_str());
  printf("\",\n    \"file\": \"");
  EncodeJSONString(edge->inputs_[0]->path().c_str());
  printf("\",\n    \"output\": \"");
  EncodeJSONString(edge->outputs_[0]->path().c_str());
  printf("\"\n  }");
}